

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defopcode.c
# Opt level: O0

int compute_dashmask(char *pattern)

{
  size_t sVar1;
  uint local_18;
  int len;
  int mask;
  int i;
  char *pattern_local;
  
  local_18 = 0;
  sVar1 = strlen(pattern);
  for (len = 0; len < (int)sVar1; len = len + 1) {
    if (pattern[((int)sVar1 + -1) - len] == '-') {
      local_18 = 1 << ((byte)len & 0x1f) | local_18;
    }
  }
  return local_18;
}

Assistant:

static int
compute_dashmask (const char *pattern)
{
  int i, mask = 0, len = strlen (pattern);

  for (i = 0; i < len; i++)
    if (pattern[len - 1 - i] == '-')
      mask |= (1 << i);
  return mask;
}